

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O0

reusable_block_list fdb_get_reusable_block(fdb_kvs_handle *handle,stale_header_info stale_header)

{
  filemgr *pfVar1;
  docio_length len;
  reusable_block_list rVar2;
  uint uVar3;
  list_elem *e_00;
  avl_node *paVar4;
  list_elem *plVar5;
  int64_t iVar6;
  ulong uVar7;
  avl_node *paVar8;
  avl_node **__ptr;
  ulong uVar9;
  avl_cmp_func *func;
  uint uVar10;
  avl_node *in_RSI;
  fdb_kvs_handle *in_RDI;
  stale_data *new_item;
  uint32_t remaining_len;
  reusable_block *blocks_arr;
  uint32_t front_margin;
  uint32_t max_blocks;
  size_t blocksize;
  size_t n_blocks;
  stale_regions sr_1;
  size_t length;
  stale_regions sr;
  filemgr_header_revnum_t *new_revnum_array;
  stale_info_entry *entry;
  stale_info_commit *commit;
  size_t uncomp_buflen;
  void *uncomp_buf;
  kvs_stat stat;
  list_elem *e_last;
  list_elem *e;
  stale_data *item;
  avl_node *avl;
  avl_tree *mergetree;
  docio_object doc;
  bool stale_tree_scan;
  bid_t prev_hdr;
  bid_t prev_offset;
  bid_t _offset;
  bid_t offset;
  filemgr_header_revnum_t *revnum_array;
  filemgr_header_revnum_t _revnum;
  filemgr_header_revnum_t revnum;
  filemgr_header_revnum_t prev_revnum;
  filemgr_header_revnum_t revnum_upto;
  btree_result br;
  btree_iterator bit;
  uint64_t item_pos;
  uint32_t max_revnum_array;
  uint32_t n_revnums;
  uint32_t item_len;
  uint32_t i;
  uint8_t keybuf [64];
  int r;
  int64_t delta;
  reusable_block_list ret;
  btree_iterator *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  filemgr *in_stack_fffffffffffffce0;
  uint64_t *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  avl_node *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  uint uVar11;
  ulong local_2f0;
  undefined1 local_2e8 [12];
  undefined4 in_stack_fffffffffffffd24;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  ulong local_2b8;
  void *local_2b0;
  undefined8 local_288;
  undefined8 local_280;
  size_t local_278;
  undefined1 local_270 [40];
  undefined8 in_stack_fffffffffffffdb8;
  undefined4 local_240;
  kvs_stat_attr_t in_stack_fffffffffffffdc4;
  void *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  docio_object *in_stack_fffffffffffffdd8;
  uint64_t in_stack_fffffffffffffde0;
  docio_handle *in_stack_fffffffffffffde8;
  void *local_210;
  void *local_1f0;
  long local_1e8;
  list_elem *local_1a8;
  avl_node *local_198;
  undefined8 local_188;
  undefined8 local_180;
  undefined1 *local_170;
  void *local_158;
  byte local_149;
  undefined8 local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  void *local_128;
  ulong local_120;
  avl_node *local_118;
  avl_node *local_110;
  avl_node *local_108;
  btree_result local_fc;
  ulong local_90;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  undefined1 local_78 [68];
  int local_34;
  long local_30;
  fdb_kvs_handle *local_28;
  avl_node *local_20;
  ulong local_10;
  avl_node *local_8;
  
  local_88 = 0x100;
  local_110 = (avl_node *)0x0;
  local_118 = (avl_node *)0x0;
  local_148 = 0xffffffffffffffff;
  local_149 = 1;
  local_28 = in_RDI;
  local_20 = in_RSI;
  docio_object::docio_object((docio_object *)in_stack_fffffffffffffcd0);
  pfVar1 = local_28->file;
  local_108 = local_20;
  local_34 = _kvs_stat_get(in_stack_fffffffffffffce0,
                           CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                           (kvs_stat *)in_stack_fffffffffffffcd0);
  local_28->bhandle->nlivenodes = local_1e8;
  local_28->bhandle->ndeltanodes = local_1e8;
  local_128 = calloc((ulong)local_88,8);
  local_84 = 0;
  e_00 = list_end(local_28->file->stale_list);
  local_198 = avl_first(&local_28->file->stale_info_tree);
  if (local_198 != (avl_node *)0x0) {
    local_1f0 = (void *)0x0;
    local_149 = 0;
    if (((compress_inmem_stale_info & 1U) != 0) &&
       (local_1f0 = calloc(1,0x20000), local_1f0 == (void *)0x0)) {
      fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/staleblock.cc"
                   ,"fdb_get_reusable_block",0x272,
                   "(fdb_get_reusable_block) calloc of \'uncomp_buf\' failed: database file \'%s\', uncomp_buflen %d\n"
                   ,local_28->file->filename,0x20000);
      free(local_128);
      local_10 = 0;
      local_8 = (avl_node *)0x0;
      goto LAB_00167efc;
    }
    while (local_198 != (avl_node *)0x0) {
      paVar4 = avl_next(local_198);
      local_110 = local_118;
      paVar8 = local_198[1].parent;
      if (local_108 < paVar8) break;
      local_210 = local_128;
      uVar10 = local_84 + 1;
      *(avl_node **)((long)local_128 + (ulong)local_84 * 8) = paVar8;
      local_118 = paVar8;
      local_84 = uVar10;
      if (local_88 <= uVar10) {
        local_88 = local_88 << 1;
        local_210 = realloc(local_128,(ulong)local_88 << 3);
      }
      if (local_210 == (void *)0x0) {
        fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/staleblock.cc"
                     ,"fdb_get_reusable_block",0x298,
                     "(fdb_get_reusable_block) realloc of \'revnum_array\' failed: database file \'%s\', max_revnum_array %d\n"
                     ,local_28->file->filename,local_88);
        free(local_1f0);
        free(local_128);
        local_10 = 0;
        local_8 = (avl_node *)0x0;
        goto LAB_00167efc;
      }
      local_128 = local_210;
      avl_remove((avl_tree *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8);
      local_1a8 = list_begin((list *)&local_198[1].left);
      while (local_1a8 != (list_elem *)0x0) {
        plVar5 = list_next(local_1a8);
        list_remove((list *)&local_198[1].left,local_1a8);
        if (local_1a8[1].prev != (list_elem *)0x0) {
          _fetch_stale_info_doc
                    ((void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     (avl_tree *)in_stack_fffffffffffffcf8,
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     in_stack_fffffffffffffce8);
        }
        filemgr_actual_stale_regions
                  ((stale_regions *)local_270,local_28->file,(bid_t)local_1a8[1].next,
                   (size_t)local_1a8[2].prev);
        memcpy(&local_240,local_270,0x30);
        if (CONCAT44(in_stack_fffffffffffffdc4,local_240) < 2) {
          _insert_n_merge((avl_tree *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd24);
        }
        else {
          for (local_7c = 0; (ulong)local_7c < CONCAT44(in_stack_fffffffffffffdc4,local_240);
              local_7c = local_7c + 1) {
            _insert_n_merge((avl_tree *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            in_stack_fffffffffffffd24);
          }
          free(in_stack_fffffffffffffdc8);
        }
        free(local_1a8[1].prev);
        free(local_1a8);
        local_1a8 = plVar5;
      }
      free(local_198);
      local_198 = paVar4;
    }
    free(local_1f0);
  }
  if ((local_149 & 1) != 0) {
    btree_iterator_init((btree *)in_stack_fffffffffffffce0,
                        (btree_iterator *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                        in_stack_fffffffffffffcd0);
    while( true ) {
      local_fc = btree_next((btree_iterator *)in_stack_fffffffffffffce0,
                            (void *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                            in_stack_fffffffffffffcd0);
      btreeblk_end((btreeblk_handle *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
      ;
      if (local_fc != BTREE_RESULT_SUCCESS) break;
      local_110 = local_118;
      paVar8 = (avl_node *)
               (local_120 >> 0x38 | (local_120 & 0xff000000000000) >> 0x28 |
                (local_120 & 0xff0000000000) >> 0x18 | (local_120 & 0xff00000000) >> 8 |
                (local_120 & 0xff000000) << 8 | (local_120 & 0xff0000) << 0x18 |
                (local_120 & 0xff00) << 0x28 | local_120 << 0x38);
      if (local_108 < paVar8) break;
      uVar10 = local_84 + 1;
      *(avl_node **)((long)local_128 + (ulong)local_84 * 8) = paVar8;
      local_118 = paVar8;
      local_84 = uVar10;
      if (local_88 <= uVar10) {
        local_88 = local_88 << 1;
        local_128 = realloc(local_128,(ulong)local_88 << 3);
      }
      local_130 = local_138 >> 0x38 | (local_138 & 0xff000000000000) >> 0x28 |
                  (local_138 & 0xff0000000000) >> 0x18 | (local_138 & 0xff00000000) >> 8 |
                  (local_138 & 0xff000000) << 8 | (local_138 & 0xff0000) << 0x18 |
                  (local_138 & 0xff00) << 0x28 | local_138 << 0x38;
      while (local_130 != 0xffffffffffffffff) {
        memset(&local_188,0,0x38);
        local_170 = local_78;
        iVar6 = docio_read_doc(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                               in_stack_fffffffffffffdd8,(bool)in_stack_fffffffffffffdd7);
        if (iVar6 < 1) {
          local_130 = 0xffffffffffffffff;
        }
        else {
          _fetch_stale_info_doc
                    ((void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     (avl_tree *)in_stack_fffffffffffffcf8,
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     in_stack_fffffffffffffce8);
          local_288 = local_188;
          local_280 = local_180;
          len.bodylen_ondisk = (undefined4)local_180;
          len.flag = local_180._4_1_;
          len.checksum = local_180._5_1_;
          len.reserved = local_180._6_2_;
          len.keylen = (undefined2)local_188;
          len.metalen = local_188._2_2_;
          len.bodylen = local_188._4_4_;
          local_278 = _fdb_get_docsize(len);
          filemgr_actual_stale_regions
                    ((stale_regions *)local_2e8,local_28->file,local_130,local_278);
          memcpy(&local_2b8,local_2e8,0x30);
          if (local_2b8 < 2) {
            _insert_n_merge((avl_tree *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            in_stack_fffffffffffffd24);
          }
          else {
            for (local_7c = 0; local_7c < local_2b8; local_7c = local_7c + 1) {
              _insert_n_merge((avl_tree *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                              in_stack_fffffffffffffd24);
            }
            free(local_2b0);
          }
          free(local_158);
          local_130 = local_140;
        }
      }
    }
    btree_iterator_free(in_stack_fffffffffffffcd0);
  }
  for (local_7c = 0; local_7c < local_84; local_7c = local_7c + 1) {
    local_120 = *(ulong *)((long)local_128 + (ulong)local_7c * 8) >> 0x38 |
                (*(ulong *)((long)local_128 + (ulong)local_7c * 8) & 0xff000000000000) >> 0x28 |
                (*(ulong *)((long)local_128 + (ulong)local_7c * 8) & 0xff0000000000) >> 0x18 |
                (*(ulong *)((long)local_128 + (ulong)local_7c * 8) & 0xff00000000) >> 8 |
                (*(ulong *)((long)local_128 + (ulong)local_7c * 8) & 0xff000000) << 8 |
                (*(ulong *)((long)local_128 + (ulong)local_7c * 8) & 0xff0000) << 0x18 |
                (*(ulong *)((long)local_128 + (ulong)local_7c * 8) & 0xff00) << 0x28 |
                *(long *)((long)local_128 + (ulong)local_7c * 8) << 0x38;
    btree_remove(local_28->staletree,&local_120);
    btreeblk_end((btreeblk_handle *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  }
  local_30 = local_28->bhandle->nlivenodes - local_1e8;
  _kvs_stat_update_attr
            ((filemgr *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (fdb_kvs_id_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
             in_stack_fffffffffffffdb8);
  local_30 = (ulong)(local_28->config).blocksize * (local_28->bhandle->ndeltanodes - local_1e8);
  _kvs_stat_update_attr
            ((filemgr *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (fdb_kvs_id_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
             in_stack_fffffffffffffdb8);
  if (e_00 == (list_elem *)0x0) {
    local_1a8 = list_begin(local_28->file->stale_list);
  }
  else {
    local_1a8 = list_next(e_00);
  }
  while (local_1a8 != (list_elem *)0x0) {
    plVar5 = local_1a8 + -1;
    local_1a8 = list_remove(local_28->file->stale_list,local_1a8);
    _insert_n_merge((avl_tree *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                    in_stack_fffffffffffffd24);
    free(plVar5);
  }
  local_2f0 = 0;
  uVar10 = local_28->file->blocksize;
  uVar7 = (ulong)uVar10;
  uVar11 = 0x100;
  paVar4 = (avl_node *)calloc(0x100,0x10);
  paVar8 = avl_first(&pfVar1->mergetree);
  uVar9 = local_2f0;
  while (local_198 = paVar8, local_2f0 = uVar9, local_198 != (avl_node *)0x0) {
    __ptr = &local_198[-1].left;
    paVar8 = avl_next(local_198);
    uVar9 = local_2f0;
    if (uVar7 <= *(uint *)&local_198[-1].right) {
      if ((ulong)*__ptr % uVar7 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = uVar10 - (int)((ulong)*__ptr % uVar7);
      }
      local_90 = (long)&(*__ptr)->parent + (ulong)uVar3;
      local_80 = *(int *)&local_198[-1].right - uVar3;
      if (uVar7 <= local_80) {
        (&paVar4->parent)[local_2f0 * 2] = (avl_node *)(local_90 / uVar7);
        (&paVar4->left)[local_2f0 * 2] = (avl_node *)(local_80 / uVar7);
        uVar9 = local_2f0 + 1;
        if (uVar11 <= uVar9) {
          uVar11 = uVar11 << 1;
          paVar4 = (avl_node *)realloc(paVar4,(ulong)uVar11 << 4);
        }
        if (uVar3 == 0) {
          avl_remove((avl_tree *)((ulong)uVar11 << 0x20),paVar4);
          free(__ptr);
        }
        else {
          *(uint *)&local_198[-1].right = uVar3;
        }
        uVar3 = local_80 % uVar10;
        if (uVar3 != 0) {
          func = (avl_cmp_func *)calloc(1,0x28);
          *(ulong *)func =
               ((long)&(&paVar4->parent)[local_2f0 * 2]->parent +
               (long)(&paVar4->left)[local_2f0 * 2]) * uVar7;
          *(uint *)(func + 8) = uVar3;
          avl_insert((avl_tree *)paVar4,(avl_node *)CONCAT44(uVar3,in_stack_fffffffffffffcf0),func);
          paVar8 = avl_next((avl_node *)(func + 0x10));
        }
      }
    }
  }
  fdb_gather_stale_blocks
            (local_28,(filemgr_header_revnum_t)local_118,0xffffffffffffffff,0xffffffffffffffff,0,
             e_00,true);
  free(local_128);
  local_10 = local_2f0;
  local_8 = paVar4;
LAB_00167efc:
  rVar2.blocks = (reusable_block *)local_8;
  rVar2.n_blocks = local_10;
  return rVar2;
}

Assistant:

reusable_block_list fdb_get_reusable_block(fdb_kvs_handle *handle,
                                           stale_header_info stale_header)
{
    int64_t delta;
    int r;
    uint8_t keybuf[64];
    uint32_t i;
    uint32_t item_len;
    uint32_t n_revnums, max_revnum_array = 256;
    uint64_t item_pos;
    btree_iterator bit;
    btree_result br;
    filemgr_header_revnum_t revnum_upto, prev_revnum = 0;
    filemgr_header_revnum_t revnum = 0, _revnum;
    filemgr_header_revnum_t *revnum_array;
    bid_t offset, _offset, prev_offset;
    bid_t prev_hdr = BLK_NOT_FOUND;
    bool stale_tree_scan = true;
    struct docio_object doc;
    struct avl_tree *mergetree = &handle->file->mergetree;
    struct avl_node *avl;
    struct stale_data *item;
    struct list_elem *e, *e_last;
    struct kvs_stat stat;

    revnum_upto = stale_header.revnum;

    r = _kvs_stat_get(handle->file, 0, &stat);
    handle->bhandle->nlivenodes = stat.nlivenodes;
    handle->bhandle->ndeltanodes = stat.nlivenodes;
    (void)r;

    revnum_array = (filemgr_header_revnum_t *)
                   calloc(max_revnum_array, sizeof(filemgr_header_revnum_t));
    n_revnums = 0;

    // remember the last stale list item to be preserved
    e_last = list_end(handle->file->stale_list);

    avl = avl_first(&handle->file->stale_info_tree);
    if (avl) {
        // if in-memory stale info exists
        void *uncomp_buf = NULL;
        size_t uncomp_buflen = 128*1024; // 128 KB by default;
        struct stale_info_commit *commit;
        struct stale_info_entry *entry;

        stale_tree_scan = false;

        if (compress_inmem_stale_info) {
            uncomp_buf = (void*)calloc(1, uncomp_buflen);
            if (!uncomp_buf) {
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                        "(fdb_get_reusable_block) "
                        "calloc of 'uncomp_buf' failed: "
                        "database file '%s', "
                        "uncomp_buflen %d\n",
                        handle->file->filename,
                        (int)uncomp_buflen);
                free(revnum_array);

                reusable_block_list ret;
                ret.n_blocks = 0;
                ret.blocks = NULL;

                return ret;
            }
        }

        while (avl) {
            commit = _get_entry(avl, struct stale_info_commit, avl);
            avl = avl_next(avl);

            prev_revnum = revnum;
            revnum = commit->revnum;
            if (revnum > revnum_upto) {
                revnum = prev_revnum;
                break;
            }

            filemgr_header_revnum_t *new_revnum_array = revnum_array;
            revnum_array[n_revnums++] = revnum;
            if (n_revnums >= max_revnum_array) {
                max_revnum_array *= 2;
                new_revnum_array = (filemgr_header_revnum_t *)
                                   realloc(revnum_array, max_revnum_array *
                                           sizeof(filemgr_header_revnum_t));
            }
            if (!new_revnum_array) {
                // realloc() of revnum_array failed.
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                        "(fdb_get_reusable_block) "
                        "realloc of 'revnum_array' failed: "
                        "database file '%s', "
                        "max_revnum_array %d\n",
                        handle->file->filename,
                        (int)max_revnum_array);
                free(uncomp_buf);
                free(revnum_array);

                reusable_block_list ret;
                ret.n_blocks = 0;
                ret.blocks = NULL;

                return ret;
            }
            revnum_array = new_revnum_array;

            avl_remove(&handle->file->stale_info_tree, &commit->avl);

            e = list_begin(&commit->doc_list);
            while (e) {
                entry = _get_entry(e, struct stale_info_entry, le);
                e = list_next(&entry->le);
                list_remove(&commit->doc_list, &entry->le);

                if (entry->ctx) {
#ifdef _DOC_COMP
                    if (compress_inmem_stale_info) {
                        // uncompression
                        void* new_uncomp_buf = uncomp_buf;
                        if (uncomp_buflen < entry->ctxlen) {
                            uncomp_buflen = entry->ctxlen;
                            new_uncomp_buf = (void*)realloc(uncomp_buf, uncomp_buflen);
                        }

                        if (!new_uncomp_buf) {
                            // realloc() of uncomp_buf failed.
                            fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                                    "(fdb_get_reusable_block) "
                                    "realloc of 'uncomp_buf' failed: "
                                    "database file '%s', "
                                    "uncomp_buflen %d, "
                                    "entry->ctxlen %d\n",
                                    handle->file->filename,
                                    (int)uncomp_buflen,
                                    (int)entry->ctxlen);
                            free(uncomp_buf);
                            free(revnum_array);

                            reusable_block_list ret;
                            ret.n_blocks = 0;
                            ret.blocks = NULL;

                            return ret;
                        }
                        uncomp_buf = new_uncomp_buf;

                        size_t len = uncomp_buflen;
                        int r = snappy_uncompress
                                ( (char*)entry->ctx, entry->comp_ctxlen,
                                  (char*)uncomp_buf, &len );
                        if (r != 0) {
                            fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_COMPRESSION_FAIL,
                                    "(fdb_get_reusable_block) "
                                    "Uncompression error from a database file '%s'"
                                    ": return value %d, header revnum %" _F64 ", "
                                    "doc offset %" _F64 "\n",
                                    handle->file->filename, r, revnum, entry->offset);
                            free(uncomp_buf);
                            free(revnum_array);

                            reusable_block_list ret;
                            ret.n_blocks = 0;
                            ret.blocks = NULL;

                            return ret;
                        }

                        // fetch the context
                        _fetch_stale_info_doc(uncomp_buf, mergetree,
                                              prev_offset, prev_hdr);
                    } else {
                        _fetch_stale_info_doc(entry->ctx, mergetree,
                                              prev_offset, prev_hdr);
                    }
#else
                    _fetch_stale_info_doc(entry->ctx, mergetree, prev_offset, prev_hdr);
#endif
                }

                // also insert/merge the system doc region
                struct stale_regions sr;

                sr = filemgr_actual_stale_regions(handle->file, entry->offset,
                                                  entry->doclen);

                if (sr.n_regions > 1) {
                    for (i=0; i<sr.n_regions; ++i){
                        _insert_n_merge(mergetree, sr.regions[i].pos, sr.regions[i].len);
                    }
                    free(sr.regions);
                } else {
                    _insert_n_merge(mergetree, sr.region.pos, sr.region.len);
                }

                free(entry->ctx);
                free(entry);
            }

            free(commit);
        }
        free(uncomp_buf);
    }

    if (stale_tree_scan) {
        // scan stale-block tree and get all stale regions
        // corresponding to commit headers whose seq number is
        // equal to or smaller than 'revnum_upto'
        btree_iterator_init(handle->staletree, &bit, NULL);
        do {
            br = btree_next(&bit, (void*)&_revnum, (void*)&_offset);
            btreeblk_end(handle->bhandle);
            if (br != BTREE_RESULT_SUCCESS) {
                break;
            }

            prev_revnum = revnum;
            revnum = _endian_decode(_revnum);
            if (revnum > revnum_upto) {
                revnum = prev_revnum;
                break;
            }

            revnum_array[n_revnums++] = revnum;
            if (n_revnums >= max_revnum_array) {
                max_revnum_array *= 2;
                revnum_array = (filemgr_header_revnum_t *)
                               realloc(revnum_array, max_revnum_array *
                                   sizeof(filemgr_header_revnum_t));
            }
            offset = _endian_decode(_offset);

            while (offset != BLK_NOT_FOUND) {
                memset(&doc, 0x0, sizeof(doc));
                // pre-allocated buffer for key
                doc.key = (void*)keybuf;

                if (docio_read_doc(handle->dhandle, offset, &doc, true) <= 0) {
                    // read fail .. escape
                    offset = BLK_NOT_FOUND;
                    continue;
                }

                _fetch_stale_info_doc(doc.body, mergetree, prev_offset, prev_hdr);

                // also insert/merge the system doc region
                size_t length = _fdb_get_docsize(doc.length);
                struct stale_regions sr;

                sr = filemgr_actual_stale_regions(handle->file, offset, length);

                if (sr.n_regions > 1) {
                    for (i=0; i<sr.n_regions; ++i){
                        _insert_n_merge(mergetree, sr.regions[i].pos, sr.regions[i].len);
                    }
                    free(sr.regions);
                } else {
                    _insert_n_merge(mergetree, sr.region.pos, sr.region.len);
                }

                // We don't need to free 'meta' as it will be NULL.
                free(doc.body);

                offset = prev_offset;
            }
        } while (true);
        btree_iterator_free(&bit);
    }

    // remove merged commit headers
    for (i=0; i<n_revnums; ++i) {
        _revnum = _endian_encode(revnum_array[i]);
        btree_remove(handle->staletree, (void*)&_revnum);
        btreeblk_end(handle->bhandle);
    }

    delta = handle->bhandle->nlivenodes - stat.nlivenodes;
    _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
    delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
    delta *= handle->config.blocksize;
    _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

    // gather stale blocks generated by removing b+tree entries
    if (e_last) {
        e = list_next(e_last);
    } else {
        e = list_begin(handle->file->stale_list);
    }
    while (e) {
        item = _get_entry(e, struct stale_data, le);
        e = list_remove(handle->file->stale_list, e);

        _insert_n_merge(mergetree, item->pos, item->len);
        free(item);
    }

    // now merge stale regions as large as possible
    size_t n_blocks =0 ;
    size_t blocksize = handle->file->blocksize;
    uint32_t max_blocks = 256;
    uint32_t front_margin;
    reusable_block_list ret;
    struct reusable_block *blocks_arr;

    blocks_arr = (struct reusable_block*)
        calloc(max_blocks, sizeof(struct reusable_block));

    avl = avl_first(mergetree);
    while (avl) {
        item = _get_entry(avl, struct stale_data, avl);
        avl = avl_next(avl);

        // A stale region can be represented as follows:
        //
        //  block x-1 |   block x  |  block x+1 |  block x+2
        //  -----+----+------------+------------+--------+----
        //   ... |  A |      B     |      C     |    D   | ...
        //  -----+----+------------+------------+--------+----
        //
        // Only segment 'B' and 'C' can be reusable, and the other segments
        // (i.e., 'A' and 'D') should be re-inserted into stale-block tree.

        if (item->len < blocksize) {
            // whole region is smaller than a block .. skip this item
            //       |    block    |  ...
            //  -----+---+-----+---+-------
            //   ... |   |/////|   |  ...
            //  -----+---+-----+---+-------
            continue;
        }

        //            <------------ item_len ------------>
        //  block x-1 |   block x  |  block x+1 |  block x+2
        //  -----+----+------------+------------+--------+----
        //   ... |  A |      B     |      C     |    D   | ...
        //  -----+----+------------+------------+--------+----
        //            ^
        //            item_pos
        if (item->pos % blocksize) {
            front_margin = blocksize - item->pos % blocksize;
        } else {
            front_margin = 0;
        }
        item_pos = item->pos + front_margin;
        item_len = item->len - front_margin;

        if (item_len < blocksize) {
            // Remaining length is smaller than a block. This means that there
            // is no reusable block in this region (even though the region size is
            // bigger than a block size) .. skip this item.
            //
            //       |   block x   |  block x+1  | ...
            //  -----+------+------+-------+-----+----
            //   ... |      |//////|///////|     | ...
            //  -----+------+------+-------+-----+----
            continue;
        }

        // calculate # blocks and add to 'blocks'
        blocks_arr[n_blocks].bid = item_pos / blocksize;
        blocks_arr[n_blocks].count = item_len / blocksize;
        n_blocks += 1;
        if (n_blocks >= max_blocks) {
            max_blocks *= 2;
            blocks_arr = (struct reusable_block*)
                realloc(blocks_arr, max_blocks * sizeof(struct reusable_block));
        }

        if (front_margin) {
            // adjust the existing item to indicate 'A' in above example
            item->len = front_margin;
        } else {
            // exactly aligned .. remove this item
            avl_remove(mergetree, &item->avl);
            free(item);
        }

        uint32_t remaining_len;
        remaining_len = item_len % blocksize;
        if (remaining_len) {
            // add a new item for the remaining region ('D' in above example)
            struct stale_data *new_item;
            new_item = (struct stale_data *)
                       calloc(1, sizeof(struct stale_data));
            new_item->pos = (blocks_arr[n_blocks-1].bid + blocks_arr[n_blocks-1].count)
                            * blocksize;
            new_item->len = remaining_len;
            avl_insert(mergetree, &new_item->avl, _reusable_offset_cmp);
            avl = avl_next(&new_item->avl);
        }
    }

    // re-write stale tree using the last revnum as a key
    // in this case, only stale regions newly generated by this function are gathered,
    // and prev_hdr is set to BLK_NOT_FOUND, as corresponding seq numbers are
    // already removed.

    // however, do not remove the remaining items in the merge-tree and continue to
    // merge them in the next block reclaim.
    fdb_gather_stale_blocks(handle, revnum, BLK_NOT_FOUND, BLK_NOT_FOUND,
                            0, e_last, true);

    free(revnum_array);

    ret.n_blocks = n_blocks;
    ret.blocks = blocks_arr;
    return ret;
}